

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

bool __thiscall tinyusdz::Layer::find_primspec_at(Layer *this,Path *path,PrimSpec **ps,string *err)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  size_type sVar2;
  bool bVar3;
  char cVar4;
  mapped_type pPVar5;
  ostream *poVar6;
  iterator iVar7;
  mapped_type *ppPVar8;
  string *args;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  undefined1 *puVar12;
  __node_base *p_Var13;
  ostringstream ss_e;
  string local_218;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
  *local_1f8;
  mapped_type local_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  if (ps == (PrimSpec **)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-types.cc"
               ,0x54);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"find_primspec_at",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x861);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar10 = "Invalid PrimSpec dst argument";
    lVar9 = 0x1d;
LAB_002a8f78:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,lVar9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (err == (string *)0x0) goto LAB_002a91ff;
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append
              ((char *)err,
               CONCAT71(local_218._M_dataplus._M_p._1_7_,(char)local_218._M_dataplus._M_p));
    puVar12 = (undefined1 *)
              CONCAT71(local_218._M_dataplus._M_p._1_7_,(char)local_218._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12 == &local_218.field_2) goto LAB_002a91ff;
  }
  else {
    if (path->_valid == false) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-types.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"find_primspec_at",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x866);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      pcVar10 = "Invalid path";
      lVar9 = 0xc;
      goto LAB_002a8f78;
    }
    sVar2 = (path->_prim_part)._M_string_length;
    args = err;
    if ((sVar2 == 0) ||
       (args = (string *)(path->_prim_part)._M_dataplus._M_p,
       *(char *)&(args->_M_dataplus)._M_p != '/')) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-types.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"find_primspec_at",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x86b);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      pcVar11 = "TODO: Relative path: {}";
      pcVar10 = "";
    }
    else {
      if ((sVar2 != 0) && (*(path->_prim_part)._M_dataplus._M_p == '/')) {
        this_00 = &this->_primspec_path_cache;
        if (this->_dirty == true) {
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
          ::_M_erase(&this_00->_M_t,
                     (_Link_type)
                     (this->_primspec_path_cache)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent);
          p_Var1 = &(this->_primspec_path_cache)._M_t._M_impl.super__Rb_tree_header;
          (this->_primspec_path_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          (this->_primspec_path_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var1->_M_header;
          (this->_primspec_path_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var1->_M_header;
          (this->_primspec_path_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          this->_dirty = false;
        }
        else {
          iVar7 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                  ::find(&this_00->_M_t,&path->_prim_part);
          if ((_Rb_tree_header *)iVar7._M_node !=
              &(this->_primspec_path_cache)._M_t._M_impl.super__Rb_tree_header) {
            *ps = *(PrimSpec **)(iVar7._M_node + 2);
            return true;
          }
        }
        p_Var13 = &(this->_prim_specs)._M_h._M_before_begin;
        local_1f8 = this_00;
        do {
          p_Var13 = p_Var13->_M_nxt;
          bVar3 = p_Var13 != (__node_base *)0x0;
          if (p_Var13 == (__node_base *)0x0) {
            return bVar3;
          }
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
          anon_unknown_240::GetPrimSpecAtPathRec
                    ((optional<const_tinyusdz::PrimSpec_*> *)&local_218,(PrimSpec *)(p_Var13 + 5),
                     local_1a8,path,0);
          cVar4 = (char)local_218._M_dataplus._M_p;
          if ((char)local_218._M_dataplus._M_p != '\0') {
            local_1f0 = (mapped_type)local_218._M_string_length;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
          pPVar5 = local_1f0;
        } while (cVar4 == '\0');
        *ps = local_1f0;
        ppPVar8 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                  ::operator[](local_1f8,&path->_prim_part);
        *ppPVar8 = pPVar5;
        return bVar3;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-types.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"find_primspec_at",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x86f);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      pcVar11 = "Path is not absolute path: {}";
      pcVar10 = "";
    }
    local_1e8[0] = local_1d8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,pcVar11,pcVar10);
    Path::full_path_name_abi_cxx11_(&local_1c8,path);
    fmt::format<std::__cxx11::string>
              (&local_218,(fmt *)local_1e8,(string *)&local_1c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,
                        (char *)CONCAT71(local_218._M_dataplus._M_p._1_7_,
                                         (char)local_218._M_dataplus._M_p),
                        local_218._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_218._M_dataplus._M_p._1_7_,(char)local_218._M_dataplus._M_p) !=
        &local_218.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_218._M_dataplus._M_p._1_7_,(char)local_218._M_dataplus._M_p),
                      local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (local_1e8[0] != local_1d8) {
      operator_delete(local_1e8[0],local_1d8[0] + 1);
    }
    if (err == (string *)0x0) goto LAB_002a91ff;
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append
              ((char *)err,
               CONCAT71(local_218._M_dataplus._M_p._1_7_,(char)local_218._M_dataplus._M_p));
    puVar12 = (undefined1 *)
              CONCAT71(local_218._M_dataplus._M_p._1_7_,(char)local_218._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12 == &local_218.field_2) goto LAB_002a91ff;
  }
  operator_delete(puVar12,local_218.field_2._M_allocated_capacity + 1);
LAB_002a91ff:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool Layer::find_primspec_at(const Path &path, const PrimSpec **ps,
                             std::string *err) const {
  if (!ps) {
    PUSH_ERROR_AND_RETURN("Invalid PrimSpec dst argument");
  }

  if (!path.is_valid()) {
    DCOUT("Invalid path.");
    PUSH_ERROR_AND_RETURN("Invalid path");
  }

  if (path.is_relative_path()) {
    // TODO
    PUSH_ERROR_AND_RETURN(fmt::format("TODO: Relative path: {}", path.full_path_name()));
  }

  if (!path.is_absolute_path()) {
    PUSH_ERROR_AND_RETURN(fmt::format("Path is not absolute path: {}", path.full_path_name()));
  }

#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  if (_dirty) {
    DCOUT("clear cache.");
    // Clear cache.
    _primspec_path_cache.clear();

    _dirty = false;
  } else {
    // First find from a cache.
    auto ret = _primspec_path_cache.find(path.prim_part());
    if (ret != _primspec_path_cache.end()) {
      DCOUT("Found cache.");
      (*ps) = ret->second;
      return true;
    }
  }

  // Brute-force search.
  for (const auto &parent : _prim_specs) {
    if (auto pv = GetPrimSpecAtPathRec(&parent.second, /* parent_path */ "",
                                       path, /* depth */ 0)) {
      (*ps) = pv.value();

      // Add to cache.
      // Assume pointer address does not change unless dirty state changes.
      _primspec_path_cache[path.prim_part()] = pv.value();
      return true;
    }
  }

  return false;
}